

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::DumpIncludeDict
          (DictionaryPrinter *this,IncludeDict *include_dict)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  TemplateDictionary *dict;
  char *pcVar3;
  long lVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  size_type *psVar7;
  ulong uVar8;
  long lVar9;
  string from_name;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  string local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
  sorted_include_dict;
  
  p_Var2 = &sorted_include_dict._M_t._M_impl.super__Rb_tree_header;
  sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  SortSections<std::map<std::__cxx11::string,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>const*>>>,ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
            (this,&sorted_include_dict,include_dict);
  if ((_Rb_tree_header *)sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      p_Var2) {
    p_Var6 = sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      lVar4 = *(long *)(*(long *)(p_Var6 + 2) + 8);
      if (*(long *)(*(long *)(p_Var6 + 2) + 0x10) != lVar4) {
        lVar9 = 0x100000000;
        uVar8 = 0;
        do {
          dict = *(TemplateDictionary **)(lVar4 + uVar8 * 8);
          pcVar3 = dict->filename_;
          if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
            from_name._M_dataplus._M_p = (pointer)&from_name.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&from_name,", **NO FILENAME SET; THIS DICT WILL BE IGNORED**","");
          }
          else {
            local_a0[0] = local_90;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,", from ","");
            plVar5 = (long *)std::__cxx11::string::append((char *)local_a0);
            from_name._M_dataplus._M_p = (pointer)&from_name.field_2;
            psVar7 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar7) {
              from_name.field_2._M_allocated_capacity = *psVar7;
              from_name.field_2._8_8_ = plVar5[3];
            }
            else {
              from_name.field_2._M_allocated_capacity = *psVar7;
              from_name._M_dataplus._M_p = (pointer)*plVar5;
            }
            from_name._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if (local_a0[0] != local_90) {
              operator_delete(local_a0[0]);
            }
          }
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"include-template ","");
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_100,*(long *)(p_Var6 + 1),
                     (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_120," (dict ","");
          GetDictNum_abi_cxx11_
                    (&local_80,this,lVar9 >> 0x20,
                     *(long *)(*(long *)(p_Var6 + 2) + 0x10) - *(long *)(*(long *)(p_Var6 + 2) + 8)
                     >> 3);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,from_name._M_dataplus._M_p,
                     from_name._M_dataplus._M_p + from_name._M_string_length);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,") -->\n","");
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          local_160._M_string_length = 0;
          local_160.field_2._M_local_buf[0] = '\0';
          IndentedWriter::Write
                    (&this->writer_,&local_e0,&local_100,&local_120,&local_80,&local_140,&local_c0,
                     &local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          if ((this->writer_).line_state_ != AT_BEGINNING) {
            __assert_fail("line_state_ == AT_BEGINNING",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/indented_writer.h"
                          ,0x50,"void ctemplate::IndentedWriter::Indent()");
          }
          piVar1 = &(this->writer_).current_indentation_;
          *piVar1 = *piVar1 + 2;
          DumpToString(this,dict);
          IndentedWriter::Dedent(&this->writer_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)from_name._M_dataplus._M_p != &from_name.field_2) {
            operator_delete(from_name._M_dataplus._M_p);
          }
          uVar8 = uVar8 + 1;
          lVar4 = *(long *)(*(long *)(p_Var6 + 2) + 8);
          lVar9 = lVar9 + 0x100000000;
        } while (uVar8 < (ulong)(*(long *)(*(long *)(p_Var6 + 2) + 0x10) - lVar4 >> 3));
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != &sorted_include_dict._M_t._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
  ::~_Rb_tree(&sorted_include_dict._M_t);
  return;
}

Assistant:

void DumpIncludeDict(const IncludeDict& include_dict) {
    map<string, const DictVector*> sorted_include_dict;
    SortSections(&sorted_include_dict, include_dict);
    for (map<string, const DictVector*>::const_iterator it =
             sorted_include_dict.begin();
         it != sorted_include_dict.end();  ++it) {
      for (vector<TemplateDictionary*>::size_type i = 0;
           i < it->second->size();  ++i) {
        TemplateDictionary* dict = (*it->second)[i];
        string from_name = (dict->filename_ && *dict->filename_) ?
            string(", from ") + dict->filename_ :
            string(", **NO FILENAME SET; THIS DICT WILL BE IGNORED**");
        writer_.Write("include-template ", it->first, " (dict ",
                      GetDictNum(static_cast<int>(i + 1), it->second->size()),
                      from_name, ") -->\n");
        writer_.Indent();
        DumpToString(*dict);
        writer_.Dedent();
      }
    }
  }